

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int string_buffer_putc16(StringBuffer *s,uint32_t c)

{
  int iVar1;
  
  iVar1 = s->len;
  if (iVar1 < s->size) {
    if (s->is_wide_char != 0) {
      s->len = iVar1 + 1;
      *(short *)((long)&s->str[1].header.ref_count + (long)iVar1 * 2) = (short)c;
      return 0;
    }
    if (c < 0x100) {
      s->len = iVar1 + 1;
      *(char *)((long)&s->str[1].header.ref_count + (long)iVar1) = (char)c;
      return 0;
    }
  }
  if ((s->size <= s->len) && (iVar1 = string_buffer_realloc(s,s->len + 1,c), iVar1 != 0)) {
    return -1;
  }
  if (s->is_wide_char == 0) {
    if (c < 0x100) {
      iVar1 = s->len;
      s->len = iVar1 + 1;
      *(char *)((long)&s->str[1].header.ref_count + (long)iVar1) = (char)c;
      return 0;
    }
    iVar1 = string_buffer_widen(s,s->size);
    if (iVar1 != 0) {
      return -1;
    }
  }
  iVar1 = s->len;
  s->len = iVar1 + 1;
  *(short *)((long)&s->str[1].header.ref_count + (long)iVar1 * 2) = (short)c;
  return 0;
}

Assistant:

static int string_buffer_putc16(StringBuffer *s, uint32_t c)
{
    if (likely(s->len < s->size)) {
        if (s->is_wide_char) {
            s->str->u.str16[s->len++] = c;
            return 0;
        } else if (c < 0x100) {
            s->str->u.str8[s->len++] = c;
            return 0;
        }
    }
    return string_buffer_putc_slow(s, c);
}